

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

int get_crl(X509_STORE_CTX *ctx,X509_CRL **pcrl,X509 *x)

{
  X509_CRL **ctx_00;
  int iVar1;
  X509_NAME *nm;
  stack_st_X509_CRL *crls;
  stack_st_X509_CRL *skcrl;
  X509_CRL *crl;
  X509 *pXStack_30;
  int crl_score;
  X509 *issuer;
  X509 *x_local;
  X509_CRL **pcrl_local;
  X509_STORE_CTX *ctx_local;
  
  pXStack_30 = (X509 *)0x0;
  crl._4_4_ = 0;
  skcrl = (stack_st_X509_CRL *)0x0;
  issuer = x;
  x_local = (X509 *)pcrl;
  pcrl_local = (X509_CRL **)ctx;
  iVar1 = get_crl_sk(ctx,(X509_CRL **)&skcrl,&stack0xffffffffffffffd0,(int *)((long)&crl + 4),
                     ctx->crls);
  ctx_00 = pcrl_local;
  if (iVar1 == 0) {
    nm = (X509_NAME *)X509_get_issuer_name((X509 *)issuer);
    crls = X509_STORE_CTX_get1_crls((X509_STORE_CTX *)ctx_00,nm);
    if ((crls != (stack_st_X509_CRL *)0x0) || (skcrl == (stack_st_X509_CRL *)0x0)) {
      get_crl_sk((X509_STORE_CTX *)pcrl_local,(X509_CRL **)&skcrl,&stack0xffffffffffffffd0,
                 (int *)((long)&crl + 4),crls);
      sk_X509_CRL_pop_free(crls,X509_CRL_free);
    }
  }
  if (skcrl != (stack_st_X509_CRL *)0x0) {
    pcrl_local[0xc] = (X509_CRL *)pXStack_30;
    *(undefined4 *)(pcrl_local + 0xd) = crl._4_4_;
    x_local->cert_info = (X509_CINF *)skcrl;
  }
  ctx_local._4_4_ = (uint)(skcrl != (stack_st_X509_CRL *)0x0);
  return ctx_local._4_4_;
}

Assistant:

static int get_crl(X509_STORE_CTX *ctx, X509_CRL **pcrl, X509 *x) {
  X509 *issuer = NULL;
  int crl_score = 0;
  X509_CRL *crl = NULL;
  STACK_OF(X509_CRL) *skcrl = NULL;
  if (get_crl_sk(ctx, &crl, &issuer, &crl_score, ctx->crls)) {
    goto done;
  }

  // Lookup CRLs from store
  skcrl = X509_STORE_CTX_get1_crls(ctx, X509_get_issuer_name(x));

  // If no CRLs found and a near match from get_crl_sk use that
  if (!skcrl && crl) {
    goto done;
  }

  get_crl_sk(ctx, &crl, &issuer, &crl_score, skcrl);

  sk_X509_CRL_pop_free(skcrl, X509_CRL_free);

done:
  // If we got any kind of CRL use it and return success
  if (crl) {
    ctx->current_crl_issuer = issuer;
    ctx->current_crl_score = crl_score;
    *pcrl = crl;
    return 1;
  }

  return 0;
}